

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

void skipdata_opstr(char *opstr,uint8_t *buffer,size_t size)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  
  if (size == 0) {
    *opstr = '\0';
  }
  else {
    iVar1 = sprintf(opstr,"0x%02x",(ulong)*buffer);
    __s = opstr + iVar1;
    for (sVar2 = 1; size != sVar2; sVar2 = sVar2 + 1) {
      iVar1 = sprintf(__s,", 0x%02x",(ulong)buffer[sVar2]);
      __s = __s + iVar1;
    }
  }
  return;
}

Assistant:

static void skipdata_opstr(char *opstr, const uint8_t *buffer, size_t size)
{
	char *p = opstr;
	int len;
	size_t i;

	if (!size) {
		opstr[0] = '\0';
		return;
	}

	len = sprintf(p, "0x%02x", buffer[0]);
	p+= len;

	for(i = 1; i < size; i++) {
		len = sprintf(p, ", 0x%02x", buffer[i]);
		p+= len;
	}
}